

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitTupleExtract(PrintExpressionContents *this,TupleExtract *curr)

{
  ostream *stream;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"tuple.extract ",0xe);
  Colors::outputColorCode(stream,"\x1b[0m");
  std::ostream::_M_insert<unsigned_long>((ulong)this->o);
  return;
}

Assistant:

void visitTupleExtract(TupleExtract* curr) {
    printMedium(o, "tuple.extract ");
    o << curr->index;
  }